

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

Primitive pbrt::CreateAccelerator
                    (string *name,vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *prims,
                    ParameterDictionary *parameters)

{
  bool bVar1;
  BVHAggregate *this;
  KdTreeAggregate *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ParameterDictionary *in_stack_00000078;
  vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *in_stack_00000080;
  Primitive *accel;
  ParameterDictionary *in_stack_000000e8;
  vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *in_stack_000000f0;
  ParameterDictionary *in_stack_00000130;
  BVHAggregate *in_stack_ffffffffffffff58;
  KdTreeAggregate *pKVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *in_stack_ffffffffffffff70;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  args;
  char *in_stack_ffffffffffffff90;
  
  args.bits = (uint64_t)in_RDI;
  Primitive::TaggedPointer((Primitive *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::vector
              ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)
               in_stack_ffffffffffffff60,
               (vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)
               in_stack_ffffffffffffff58);
    this = BVHAggregate::Create(in_stack_00000080,in_stack_00000078);
    Primitive::TaggedPointer<pbrt::BVHAggregate>
              ((Primitive *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Primitive::operator=
              ((Primitive *)in_stack_ffffffffffffff60,(Primitive *)in_stack_ffffffffffffff58);
    std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::~vector
              ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)this);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      ErrorExit<std::__cxx11::string_const&>
                (in_stack_ffffffffffffff90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
    }
    pKVar2 = (KdTreeAggregate *)&stack0xffffffffffffff90;
    std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::vector
              ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)
               in_stack_ffffffffffffff60,
               (vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)pKVar2);
    this_00 = KdTreeAggregate::Create(in_stack_000000f0,in_stack_000000e8);
    Primitive::TaggedPointer<pbrt::KdTreeAggregate>((Primitive *)this_00,pKVar2);
    Primitive::operator=((Primitive *)this_00,(Primitive *)pKVar2);
    std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::~vector
              (in_stack_ffffffffffffff70);
  }
  bVar1 = TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              (in_stack_ffffffffffffff90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
  }
  ParameterDictionary::ReportUnused(in_stack_00000130);
  return (Primitive)
         (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          )args.bits;
}

Assistant:

Primitive CreateAccelerator(const std::string &name, std::vector<Primitive> prims,
                            const ParameterDictionary &parameters) {
    Primitive accel = nullptr;
    if (name == "bvh")
        accel = BVHAggregate::Create(std::move(prims), parameters);
    else if (name == "kdtree")
        accel = KdTreeAggregate::Create(std::move(prims), parameters);
    else
        ErrorExit("%s: accelerator type unknown.", name);

    if (!accel)
        ErrorExit("%s: unable to create accelerator.", name);

    parameters.ReportUnused();
    return accel;
}